

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::ClassEscapePass1
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,MatchCharNode *deferredCharNode,
          MatchSetNode *deferredSetNode,bool *previousSurrogatePart)

{
  StandardChars<unsigned_char> *pSVar1;
  code *pcVar2;
  CharCount n;
  bool bVar3;
  EncodedChar EVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined4 *puVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  Char local_32 [4];
  Char c;
  
  if (this->inputLim <= this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xa06,"(!IsEOF())","!IsEOF()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar10 = 0;
  }
  pSVar1 = this->standardEncodedChars;
  EVar4 = ECLookahead(this,0);
  bVar3 = StandardChars<unsigned_char>::IsOctal(pSVar1,EVar4);
  if (bVar3) {
    iVar13 = 3;
    uVar11 = 0;
    do {
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,0);
      uVar6 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
      uVar12 = uVar6 + uVar11 * 8;
      if (0xff < uVar12) break;
      ECConsume(this,1);
      iVar13 = iVar13 + -1;
      uVar11 = uVar12;
      if (iVar13 == 0) break;
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,0);
      bVar3 = StandardChars<unsigned_char>::IsOctal(pSVar1,EVar4);
    } while (bVar3);
    local_32[0] = Chars<char16_t>::UTC(uVar11 & 0xffff);
    goto LAB_00d30b2d;
  }
  local_32[0] = NextChar(this);
  switch(local_32[0]) {
  case L'b':
    local_32[0] = L'\b';
    break;
  case L'c':
    pSVar1 = this->standardEncodedChars;
    EVar4 = ECLookahead(this,0);
    bVar3 = StandardChars<unsigned_char>::IsWord(pSVar1,EVar4);
    if (!bVar3) {
      ECRevert(this,1);
      deferredCharNode->cs[0] = L'\\';
      return &deferredCharNode->super_Node;
    }
    bVar5 = ECLookahead(this,0);
    local_32[0] = Chars<char16_t>::UTC((uint)(bVar5 & 0x1f));
    n = 1;
LAB_00d30976:
    ECConsume(this,n);
    break;
  case L'd':
    StandardChars<char16_t>::SetDigits(this->standardChars,this->ctAllocator,&deferredSetNode->set);
    return &deferredSetNode->super_Node;
  case L'e':
  case L'g':
  case L'h':
  case L'i':
  case L'j':
  case L'k':
  case L'l':
  case L'm':
  case L'o':
  case L'p':
  case L'q':
    break;
  case L'f':
    local_32[0] = L'\f';
    break;
  case L'n':
    local_32[0] = L'\n';
    break;
  case L'r':
    local_32[0] = L'\r';
    break;
  case L's':
    StandardChars<char16_t>::SetWhitespace
              (this->standardChars,this->ctAllocator,&deferredSetNode->set);
    return &deferredSetNode->super_Node;
  case L't':
    local_32[0] = L'\t';
    break;
  case L'u':
    if (((this->unicodeFlagPresent != true) ||
        (iVar13 = TryParseExtendedUnicodeEscape(this,local_32,previousSurrogatePart,false),
        iVar13 < 1)) && (this->next + 4 <= this->inputLim)) {
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,0);
      bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
      if (bVar3) {
        pSVar1 = this->standardEncodedChars;
        EVar4 = ECLookahead(this,1);
        bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
        if (bVar3) {
          pSVar1 = this->standardEncodedChars;
          EVar4 = ECLookahead(this,2);
          bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
          if (bVar3) {
            pSVar1 = this->standardEncodedChars;
            EVar4 = ECLookahead(this,3);
            bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
            if (bVar3) {
              pSVar1 = this->standardEncodedChars;
              EVar4 = ECLookahead(this,0);
              uVar6 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
              pSVar1 = this->standardEncodedChars;
              EVar4 = ECLookahead(this,1);
              uVar7 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
              pSVar1 = this->standardEncodedChars;
              EVar4 = ECLookahead(this,2);
              uVar8 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
              pSVar1 = this->standardEncodedChars;
              EVar4 = ECLookahead(this,3);
              uVar9 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
              local_32[0] = Chars<char16_t>::UTC(uVar8 << 4 | uVar9 | uVar6 << 0xc | uVar7 << 8);
              n = 4;
              goto LAB_00d30976;
            }
          }
        }
      }
    }
    break;
  case L'v':
    local_32[0] = L'\v';
    break;
  case L'w':
    StandardChars<char16_t>::SetWordChars
              (this->standardChars,this->ctAllocator,&deferredSetNode->set);
    return &deferredSetNode->super_Node;
  case L'x':
    if (this->next + 2 <= this->inputLim) {
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,0);
      bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
      if (bVar3) {
        pSVar1 = this->standardEncodedChars;
        EVar4 = ECLookahead(this,1);
        bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
        if (bVar3) {
          pSVar1 = this->standardEncodedChars;
          EVar4 = ECLookahead(this,0);
          uVar6 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
          pSVar1 = this->standardEncodedChars;
          EVar4 = ECLookahead(this,1);
          uVar7 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
          local_32[0] = Chars<char16_t>::UTC(uVar6 << 4 | uVar7);
          n = 2;
          goto LAB_00d30976;
        }
      }
    }
    break;
  default:
    if (local_32[0] == L'D') {
      StandardChars<char16_t>::SetNonDigits
                (this->standardChars,this->ctAllocator,&deferredSetNode->set);
      return &deferredSetNode->super_Node;
    }
    if (local_32[0] == L'S') {
      StandardChars<char16_t>::SetNonWhitespace
                (this->standardChars,this->ctAllocator,&deferredSetNode->set);
      return &deferredSetNode->super_Node;
    }
    if (local_32[0] == L'W') {
      StandardChars<char16_t>::SetNonWordChars
                (this->standardChars,this->ctAllocator,&deferredSetNode->set);
      return &deferredSetNode->super_Node;
    }
  }
LAB_00d30b2d:
  deferredCharNode->cs[0] = local_32[0];
  return &deferredCharNode->super_Node;
}

Assistant:

Node* Parser<P, IsLiteral>::ClassEscapePass1(MatchCharNode* deferredCharNode, MatchSetNode* deferredSetNode, bool& previousSurrogatePart)
    {
        // Checked for terminating 0 is pass 0
        Assert(!IsEOF());
        if (standardEncodedChars->IsOctal(ECLookahead()))
        {
            // As per Annex B, allow octal escapes instead of just \0 (and \8 and \9 are identity escapes).
            // Must be between 1 and 3 octal digits.
            uint n = 0;
            CharCount digits = 0;
            do
            {
                uint m = n * 8  + standardEncodedChars->DigitValue(ECLookahead());
                if (m > Chars<uint8>::MaxUChar) //Regex octal codes only support single byte (ASCII) characters.
                    break;
                n = m;
                ECConsume();
                digits++;
            }
            while (digits < 3 && standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not octal
            deferredCharNode->cs[0] = UTC((UChar)n);
            return deferredCharNode;
        }
        else
        {
            Char c = NextChar();
            switch (c)
            {
            case 'b':
                c = '\b';
                break; // fall-through for identity escape
            case 'f':
                c = '\f';
                break; // fall-through for identity escape
            case 'n':
                c = '\n';
                break; // fall-through for identity escape
            case 'r':
                c = '\r';
                break; // fall-through for identity escape
            case 't':
                c = '\t';
                break; // fall-through for identity escape
            case 'v':
                c = '\v';
                break; // fall-through for identity escape
            case 'd':
                standardChars->SetDigits(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 'D':
                standardChars->SetNonDigits(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 's':
                standardChars->SetWhitespace(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 'S':
                standardChars->SetNonWhitespace(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 'w':
                standardChars->SetWordChars(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 'W':
                standardChars->SetNonWordChars(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 'c':
                if (standardEncodedChars->IsWord(ECLookahead())) // terminating 0 is not a word character
                {
                    c = UTC(Chars<EncodedChar>::CTU(ECLookahead()) % 32);
                    ECConsume();
                    // fall-through for identity escape
                }
                else
                {
                    // If the lookahead is a non-alphanumeric and not an underscore ('_'), then treat '\' and 'c' separately.
                    //#sec-regular-expression-patterns-semantics 
                    ECRevert(1); //Put cursor back at 'c' and treat it as a non-escaped character.
                    deferredCharNode->cs[0] = '\\';
                    return deferredCharNode;
                }
                break;
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(1))));
                    ECConsume(2);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B
                break;
            case 'u':
                if (unicodeFlagPresent && TryParseExtendedUnicodeEscape(c, previousSurrogatePart) > 0)
                    break;
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(3))));
                    ECConsume(4);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B.
                break;
            default:
                // As per Annex B, allow anything other than newlines and above. Embedded 0 is ok.
                break;
            }

            // Must be an identity escape
            deferredCharNode->cs[0] = c;
            return deferredCharNode;
        }
    }